

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_address.cpp
# Opt level: O0

void cfd::js::api::ParseTapBranch
               (vector<cfd::js::api::TapScriptTreeItemStruct,_std::allocator<cfd::js::api::TapScriptTreeItemStruct>_>
                *list,TapBranch *branch,uint8_t depth)

{
  byte bVar1;
  uint32_t uVar2;
  size_type sVar3;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  allocator local_3b1;
  string local_3b0 [32];
  _Base_ptr local_390;
  undefined1 local_388;
  allocator local_379;
  string local_378 [32];
  ByteData256 local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340 [32];
  ByteData256 local_320;
  string local_308 [32];
  undefined1 local_2e8 [8];
  TapScriptTreeItemStruct item;
  value_type *target_branch;
  uint32_t current_depth;
  uint32_t index;
  string past_branch_hash;
  allocator local_209;
  string local_208 [32];
  _Base_ptr local_1e8;
  undefined1 local_1e0;
  allocator local_1d1;
  string local_1d0 [32];
  _Base_ptr local_1b0;
  undefined1 local_1a8;
  allocator local_199;
  string local_198 [32];
  Script local_178;
  string local_140 [32];
  ByteData256 local_120;
  string local_108 [48];
  undefined1 local_d8 [8];
  TapScriptTreeItemStruct leaf_data;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_38 [4];
  uint32_t branch_max;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> branches;
  uint8_t depth_local;
  TapBranch *branch_local;
  vector<cfd::js::api::TapScriptTreeItemStruct,_std::allocator<cfd::js::api::TapScriptTreeItemStruct>_>
  *list_local;
  
  cfd::core::TapBranch::GetBranchList();
  sVar3 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size(local_38);
  leaf_data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = (uint)sVar3;
  TapScriptTreeItemStruct::TapScriptTreeItemStruct((TapScriptTreeItemStruct *)local_d8);
  local_d8._0_4_ =
       leaf_data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + depth;
  cfd::core::TapBranch::GetBaseHash();
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&leaf_data,local_108);
  std::__cxx11::string::~string(local_108);
  core::ByteData256::~ByteData256(&local_120);
  bVar1 = cfd::core::TapBranch::HasTapLeaf();
  if ((bVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"tapscript",&local_199);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&leaf_data.related_branch_hash.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_198)
    ;
    local_1b0 = (_Base_ptr)pVar4.first._M_node;
    local_1a8 = pVar4.second;
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"leafVersion",&local_1d1);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&leaf_data.related_branch_hash.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_1d0)
    ;
    local_1e8 = (_Base_ptr)pVar4.first._M_node;
    local_1e0 = pVar4.second;
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  }
  else {
    cfd::core::TapBranch::GetScript();
    cfd::core::Script::GetHex_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&leaf_data.field_0x20,local_140);
    std::__cxx11::string::~string(local_140);
    core::Script::~Script(&local_178);
    bVar1 = cfd::core::TapBranch::GetLeafVersion();
    leaf_data._64_8_ = ZEXT18(bVar1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"relatedBranchHash",&local_209);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&leaf_data.related_branch_hash.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_208);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::
  vector<cfd::js::api::TapScriptTreeItemStruct,std::allocator<cfd::js::api::TapScriptTreeItemStruct>>
  ::emplace_back<cfd::js::api::TapScriptTreeItemStruct&>
            ((vector<cfd::js::api::TapScriptTreeItemStruct,std::allocator<cfd::js::api::TapScriptTreeItemStruct>>
              *)list,(TapScriptTreeItemStruct *)local_d8);
  std::__cxx11::string::string((string *)&current_depth,(string *)&leaf_data);
  for (target_branch._4_4_ = 0;
      target_branch._4_4_ <
      leaf_data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      target_branch._4_4_ = target_branch._4_4_ + 1) {
    uVar2 = ~target_branch._4_4_ +
            leaf_data.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ +
            (uint)depth;
    item.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at
                           (local_38,(ulong)target_branch._4_4_);
    TapScriptTreeItemStruct::TapScriptTreeItemStruct((TapScriptTreeItemStruct *)local_2e8);
    local_2e8._0_4_ = uVar2;
    cfd::core::TapBranch::GetBranchHash((uchar)&local_320);
    cfd::core::ByteData256::GetHex_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&item,local_308);
    std::__cxx11::string::~string(local_308);
    core::ByteData256::~ByteData256(&local_320);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &item.leaf_version,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&current_depth);
    cfd::core::TapBranch::GetCurrentBranchHash();
    cfd::core::ByteData256::GetHex_abi_cxx11_();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &item.leaf_version,local_340);
    std::__cxx11::string::~string((string *)local_340);
    core::ByteData256::~ByteData256(&local_358);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_378,"tapscript",&local_379);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&item.related_branch_hash.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_378)
    ;
    local_390 = (_Base_ptr)pVar4.first._M_node;
    local_388 = pVar4.second;
    std::__cxx11::string::~string(local_378);
    std::allocator<char>::~allocator((allocator<char> *)&local_379);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b0,"leafVersion",&local_3b1);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&item.related_branch_hash.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_3b0);
    std::__cxx11::string::~string(local_3b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
    std::
    vector<cfd::js::api::TapScriptTreeItemStruct,std::allocator<cfd::js::api::TapScriptTreeItemStruct>>
    ::emplace_back<cfd::js::api::TapScriptTreeItemStruct&>
              ((vector<cfd::js::api::TapScriptTreeItemStruct,std::allocator<cfd::js::api::TapScriptTreeItemStruct>>
                *)list,(TapScriptTreeItemStruct *)local_2e8);
    std::__cxx11::string::operator=((string *)&current_depth,(string *)&item);
    ParseTapBranch(list,(TapBranch *)
                        item.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (char)uVar2 + '\x01');
    TapScriptTreeItemStruct::~TapScriptTreeItemStruct((TapScriptTreeItemStruct *)local_2e8);
  }
  std::__cxx11::string::~string((string *)&current_depth);
  TapScriptTreeItemStruct::~TapScriptTreeItemStruct((TapScriptTreeItemStruct *)local_d8);
  std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(local_38);
  return;
}

Assistant:

static void ParseTapBranch(
    std::vector<TapScriptTreeItemStruct>* list, const TapBranch& branch,
    uint8_t depth) {
  auto branches = branch.GetBranchList();
  uint32_t branch_max = static_cast<uint32_t>(branches.size());
  TapScriptTreeItemStruct leaf_data;
  leaf_data.depth = branch_max + depth;
  leaf_data.tap_branch_hash = branch.GetBaseHash().GetHex();
  if (branch.HasTapLeaf()) {
    leaf_data.tapscript = branch.GetScript().GetHex();
    leaf_data.leaf_version = branch.GetLeafVersion();
  } else {
    leaf_data.ignore_items.insert("tapscript");
    leaf_data.ignore_items.insert("leafVersion");
  }
  leaf_data.ignore_items.insert("relatedBranchHash");
  list->emplace_back(leaf_data);

  std::string past_branch_hash = leaf_data.tap_branch_hash;
  for (uint32_t index = 0; index < branch_max; ++index) {
    uint32_t current_depth = branch_max - 1 - index + depth;
    auto& target_branch = branches.at(index);
    // set value (branch hash)
    TapScriptTreeItemStruct item;
    item.depth = current_depth;
    item.tap_branch_hash =
        branch.GetBranchHash(static_cast<uint8_t>(index)).GetHex();
    item.related_branch_hash.emplace_back(past_branch_hash);
    item.related_branch_hash.emplace_back(
        target_branch.GetCurrentBranchHash().GetHex());
    item.ignore_items.insert("tapscript");
    item.ignore_items.insert("leafVersion");
    list->emplace_back(item);
    past_branch_hash = item.tap_branch_hash;

    ParseTapBranch(list, target_branch, current_depth + 1);
  }
}